

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O3

void __thiscall cmQtAutoMocUic::InitJobs(cmQtAutoMocUic *this)

{
  if (((this->MocConst_).Enabled == true) &&
     ((this->MocConst_).PredefsCmd.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->MocConst_).PredefsCmd.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    cmWorkerPool::EmplaceJob<cmQtAutoMocUic::JobMocPredefsT>(&this->WorkerPool_);
  }
  CreateParseJobs<cmQtAutoMocUic::JobParseHeaderT>(this,&(this->BaseEval_).Headers);
  CreateParseJobs<cmQtAutoMocUic::JobParseSourceT>(this,&(this->BaseEval_).Sources);
  cmWorkerPool::EmplaceJob<cmQtAutoMocUic::JobEvaluateT>(&this->WorkerPool_);
  return;
}

Assistant:

void cmQtAutoMocUic::InitJobs()
{
  // Add moc_predefs.h job
  if (MocConst().Enabled && !MocConst().PredefsCmd.empty()) {
    WorkerPool().EmplaceJob<JobMocPredefsT>();
  }
  // Add header parse jobs
  CreateParseJobs<JobParseHeaderT>(BaseEval().Headers);
  // Add source parse jobs
  CreateParseJobs<JobParseSourceT>(BaseEval().Sources);
  // Add evaluate job
  WorkerPool().EmplaceJob<JobEvaluateT>();
}